

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O2

void __thiscall
llvm::sys::fs::directory_iterator::directory_iterator
          (directory_iterator *this,Twine *path,error_code *ec,bool follow_symlinks)

{
  element_type *this_00;
  undefined1 in_R8B;
  StringRef SVar1;
  error_code eVar2;
  StringRef path_00;
  SmallString<128U> path_storage;
  __shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type local_a8;
  
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->FollowSymlinks = follow_symlinks;
  std::make_shared<llvm::sys::fs::detail::DirIterState>();
  std::__shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2> *)this,
             &local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  local_b8._M_ptr = &local_a8;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8000000000;
  this_00 = (this->State).
            super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&local_b8);
  path_00.Data = SVar1.Length;
  path_00.Length._0_1_ = this->FollowSymlinks;
  path_00.Length._1_7_ = 0;
  eVar2 = detail::directory_iterator_construct
                    ((detail *)this_00,(DirIterState *)SVar1.Data,path_00,(bool)in_R8B);
  ec->_M_value = eVar2._M_value;
  ec->_M_cat = eVar2._M_cat;
  update_error_code_for_current_entry(this,ec);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_b8);
  return;
}

Assistant:

explicit directory_iterator(const Twine &path, std::error_code &ec,
                              bool follow_symlinks = true)
      : FollowSymlinks(follow_symlinks) {
    State = std::make_shared<detail::DirIterState>();
    SmallString<128> path_storage;
    ec = detail::directory_iterator_construct(
        *State, path.toStringRef(path_storage), FollowSymlinks);
    update_error_code_for_current_entry(ec);
  }